

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::Limits> *
wasm::WATParser::limits32<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::Limits> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  optional<unsigned_int> oVar1;
  optional<unsigned_int> oVar2;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  oVar1 = Lexer::takeU<unsigned_int>(&ctx->in);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected initial size",&local_21);
    Lexer::err(&local_48,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Limits,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::Limits,wasm::Err> *)__return_storage_ptr__,
               &local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    oVar2 = Lexer::takeU<unsigned_int>(&ctx->in);
    *(ulong *)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>
               .super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> =
         (ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 8) =
         (ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    *(byte *)((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x10) =
         oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged & 1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits32(Ctx& ctx) {
  auto n = ctx.in.takeU32();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU32();
  return ctx.makeLimits(uint64_t(*n), m);
}